

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_ATTEST_Unmarshal(TPMS_ATTEST *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  UINT32 UVar3;
  TPM_RC TVar4;
  UINT64 UVar5;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar4 = 0x9a;
  if (3 < iVar1) {
    UVar3 = ByteArrayToUint32(*buffer);
    target->magic = UVar3;
    *buffer = *buffer + 4;
    iVar1 = *size;
    *size = iVar1 + -2;
    TVar4 = 0x9a;
    if (1 < iVar1) {
      UVar2 = ByteArrayToUint16(*buffer);
      target->type = UVar2;
      *buffer = *buffer + 2;
      TVar4 = TPM2B_NAME_Unmarshal(&target->qualifiedSigner,buffer,size);
      if (((TVar4 == 0) &&
          (TVar4 = TPM2B_DATA_Unmarshal(&target->extraData,buffer,size), TVar4 == 0)) &&
         (TVar4 = TPMS_CLOCK_INFO_Unmarshal(&target->clockInfo,buffer,size), TVar4 == 0)) {
        iVar1 = *size;
        *size = iVar1 + -8;
        TVar4 = 0x9a;
        if (7 < iVar1) {
          UVar5 = ByteArrayToUint64(*buffer);
          target->firmwareVersion = UVar5;
          *buffer = *buffer + 8;
          TVar4 = TPMU_ATTEST_Unmarshal(&target->attested,buffer,size,(uint)target->type);
          return TVar4;
        }
      }
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPMS_ATTEST_Unmarshal(TPMS_ATTEST *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_GENERATED_Unmarshal((TPM_GENERATED *)&(target->magic), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ST_ATTEST_Unmarshal((TPMI_ST_ATTEST *)&(target->type), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->qualifiedSigner), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DATA_Unmarshal((TPM2B_DATA *)&(target->extraData), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMS_CLOCK_INFO_Unmarshal((TPMS_CLOCK_INFO *)&(target->clockInfo), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT64_Unmarshal((UINT64 *)&(target->firmwareVersion), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_ATTEST_Unmarshal((TPMU_ATTEST *)&(target->attested), buffer, size, (UINT32)target->type);
    return result;
}